

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<int,_long,_11>::Addition(int *lhs,long *rhs,int *result)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  undefined4 *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int64_t tmp;
  long local_38;
  long local_30;
  long local_28;
  undefined4 *local_20;
  
  local_28 = 0;
  local_30 = (long)*in_RDI;
  local_38 = *in_RSI;
  local_20 = in_RDX;
  bVar4 = AdditionHelper<long,_long,_10>::Addition(&local_30,&local_38,&local_28);
  lVar2 = local_28;
  bVar1 = false;
  if (bVar4) {
    iVar5 = std::numeric_limits<int>::max();
    lVar3 = local_28;
    bVar1 = false;
    if (lVar2 <= iVar5) {
      iVar5 = std::numeric_limits<int>::min();
      bVar1 = iVar5 <= lVar3;
    }
  }
  if (bVar1) {
    *local_20 = (int)local_28;
  }
  return bVar1;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        //rhs is std::int64_t, lhs signed
        std::int64_t tmp = 0;

        if( AdditionHelper< std::int64_t, std::int64_t, AdditionState_CastInt64CheckOverflow >::Addition( (std::int64_t)lhs, (std::int64_t)rhs, tmp ) &&
            tmp <= std::numeric_limits<T>::max() &&
            tmp >= std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return true;
        }

        return false;
    }